

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliZ.hpp
# Opt level: O2

SquareMatrix<double> __thiscall qclab::qgates::PauliZ<double>::matrix(PauliZ<double> *this)

{
  data_type extraout_RDX;
  SquareMatrix<double> SVar1;
  
  dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,1.0,0.0,0.0,-1.0);
  SVar1.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar1.size_ = (size_type_conflict)this;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 ,  0 ,
                                                  0 , -1 ) ;
        }